

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O1

int __thiscall asmjit::v1_14::a64::PrologEpilogInfo::init(PrologEpilogInfo *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX EVar1;
  int iVar2;
  Iterator __begin3;
  long lVar3;
  uint32_t uVar4;
  GroupData *pGVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  bool bVar9;
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    pGVar5 = (this->groups)._data + lVar3;
    EVar1 = ctx[lVar3 + 0x50];
    uVar8 = *(uint *)(ctx + lVar3 * 4 + 0x40) & *(uint *)(ctx + lVar3 * 4 + 0x30);
    if ((lVar3 == 0) && (((byte)*ctx & 0x10) != 0)) {
      pGVar5->pairs[0].offset = (uint16_t)uVar4;
      pGVar5->pairs[0].ids[0] = '\x1d';
      pGVar5->pairs[0].ids[1] = '\x1e';
      uVar4 = uVar4 + (uint)(byte)EVar1 * 2;
      uVar8 = uVar8 & 0x9fffffff;
      uVar7 = 1;
    }
    else {
      uVar7 = 0;
    }
    uVar6 = 0;
    if (uVar8 == 0) {
      bVar9 = false;
    }
    else {
      do {
        iVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
          }
        }
        pGVar5->pairs[uVar7].ids[uVar6] = (uint8_t)iVar2;
        bVar9 = (int)uVar6 != 1;
        if (!bVar9) {
          pGVar5->pairs[uVar7].offset = (uint16_t)uVar4;
          uVar4 = uVar4 + (uint)(byte)EVar1 + (uint)(byte)EVar1;
          uVar7 = uVar7 + 1;
        }
        uVar6 = (ulong)bVar9;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
    }
    if (bVar9) {
      pGVar5->pairs[uVar7].ids[1] = 0xff;
      pGVar5->pairs[uVar7].offset = (uint16_t)uVar4;
      uVar4 = uVar4 + (uint)(byte)EVar1 * 2;
      uVar7 = uVar7 + 1;
    }
    pGVar5->pairCount = uVar7;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  this->sizeTotal = uVar4;
  return 0;
}

Assistant:

Error init(const FuncFrame& frame) noexcept {
    uint32_t offset = 0;

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup::kGp, RegGroup::kVec>{}) {
      GroupData& data = groups[group];

      uint32_t n = 0;
      uint32_t pairCount = 0;
      RegPair* pairs = data.pairs;

      uint32_t slotSize = frame.saveRestoreRegSize(group);
      uint32_t savedRegs = frame.savedRegs(group);

      if (group == RegGroup::kGp && frame.hasPreservedFP()) {
        // Must be at the beginning of the push/pop sequence.
        ASMJIT_ASSERT(pairCount == 0);

        pairs[0].offset = uint16_t(offset);
        pairs[0].ids[0] = Gp::kIdFp;
        pairs[0].ids[1] = Gp::kIdLr;
        offset += slotSize * 2;
        pairCount++;

        savedRegs &= ~Support::bitMask(Gp::kIdFp, Gp::kIdLr);
      }

      Support::BitWordIterator<uint32_t> it(savedRegs);
      while (it.hasNext()) {
        pairs[pairCount].ids[n] = uint8_t(it.next());

        if (++n == 2) {
          pairs[pairCount].offset = uint16_t(offset);
          offset += slotSize * 2;

          n = 0;
          pairCount++;
        }
      }

      if (n == 1) {
        pairs[pairCount].ids[1] = uint8_t(BaseReg::kIdBad);
        pairs[pairCount].offset = uint16_t(offset);
        offset += slotSize * 2;
        pairCount++;
      }

      data.pairCount = pairCount;
    }

    sizeTotal = offset;
    return kErrorOk;
  }